

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O2

void convolve_Gaussian(uchar (*inpic) [512] [512],float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],float sigma,int pic_t,int pic_x,int pic_y,int start,
                      int frame,int time)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  float *pfVar7;
  float *pfVar8;
  uchar (*pauVar9) [512];
  long lVar10;
  ulong uVar11;
  uchar (*pauVar12) [512];
  float *pfVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float (*pafVar17) [512];
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  float mask [100];
  
  if (OUTPUT_SMOOTH != 0) {
    puts("\nStart of 3D convolution");
    printf("Time: %d Frame: %d\n",(ulong)(uint)time,(ulong)(uint)frame);
  }
  fflush(_stdout);
  uVar19 = (uint)(sigma * 6.0 + 1.0);
  uVar20 = uVar19 | 1;
  uVar4 = (long)(CONCAT44((int)uVar20 >> 0x1f,uVar19) | 1) / 2;
  iVar1 = (int)uVar4;
  if (pic_t < (int)uVar20) {
    puts("\nFatal error: not enough images");
    exit(1);
  }
  if ((sigma != 0.0) || (NAN(sigma))) {
    fVar24 = 0.0;
    dVar22 = (double)sigma;
    uVar6 = 0;
    uVar18 = 0;
    if (0 < (int)uVar20) {
      uVar18 = (ulong)uVar20;
    }
    for (; uVar18 != uVar6; uVar6 = uVar6 + 1) {
      iVar2 = (int)uVar6 - iVar1;
      dVar23 = exp((double)-(iVar2 * iVar2) / ((dVar22 + dVar22) * dVar22));
      fVar21 = (float)(dVar23 * (1.0 / (dVar22 * 2.5066282746310002)));
      mask[uVar6] = fVar21;
      fVar24 = fVar24 + fVar21;
    }
    dVar22 = (double)fVar24;
  }
  else {
    mask[0] = 1.0;
    dVar22 = 1.0;
  }
  if (OUTPUT_SMOOTH != 0) {
    uVar6 = 0;
    printf("Size: %d Offset: %d\nMask values: ",(ulong)uVar20,uVar4 & 0xffffffff);
    uVar4 = (ulong)uVar20;
    if ((int)uVar20 < 1) {
      uVar4 = uVar6;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      printf("%f ",(double)mask[uVar6]);
    }
    printf("\nSum of mask values: %f\n",dVar22);
  }
  lVar5 = 0;
  uVar4 = 0;
  if (0 < pic_y) {
    uVar4 = (ulong)(uint)pic_y;
  }
  uVar6 = 0;
  if (0 < pic_x) {
    uVar6 = (ulong)(uint)pic_x;
  }
  pafVar17 = pic0;
  for (uVar18 = 0; uVar18 != uVar6; uVar18 = uVar18 + 1) {
    for (lVar10 = 0; uVar4 * 4 - lVar10 != 0; lVar10 = lVar10 + 4) {
      *(undefined4 *)((long)pic1[0] + lVar5 + lVar10) = 0;
      *(undefined4 *)((long)pic0[0] + lVar5 + lVar10) = 0;
    }
    lVar5 = lVar5 + 0x800;
  }
  if ((sigma != 0.0) || (NAN(sigma))) {
    lVar5 = (long)-iVar1;
    lVar10 = (long)iVar1;
    for (uVar18 = 0; uVar18 != uVar6; uVar18 = uVar18 + 1) {
      for (uVar11 = 0; uVar11 != uVar4; uVar11 = uVar11 + 1) {
        fVar24 = 0.0;
        pfVar7 = mask;
        iVar2 = (frame - iVar1) - start;
        for (lVar16 = lVar5; lVar16 <= lVar10; lVar16 = lVar16 + 1) {
          fVar24 = fVar24 + (float)inpic[iVar2][uVar18][uVar11] * *pfVar7;
          iVar2 = iVar2 + 1;
          pfVar7 = pfVar7 + 1;
        }
        pic0[uVar18][uVar11] = fVar24;
      }
    }
    if (OUTPUT_SMOOTH != 0) {
      puts("Convolution in t direction completed");
    }
    iVar2 = pic_x - iVar1;
    if (pic_x - iVar1 < iVar1) {
      iVar2 = iVar1;
    }
    for (lVar16 = lVar10; lVar16 != iVar2; lVar16 = lVar16 + 1) {
      uVar6 = 0;
      pfVar7 = *pafVar17;
      for (; uVar6 != uVar4; uVar6 = uVar6 + 1) {
        fVar24 = 0.0;
        pfVar8 = mask;
        pfVar13 = pfVar7;
        for (lVar15 = lVar5; lVar15 <= lVar10; lVar15 = lVar15 + 1) {
          fVar24 = fVar24 + (*(float (*) [512])pfVar13)[0] * *pfVar8;
          pfVar13 = (float *)((long)pfVar13 + 0x800);
          pfVar8 = pfVar8 + 1;
        }
        pic1[lVar16][uVar6] = fVar24;
        pfVar7 = pfVar7 + 1;
      }
      pafVar17 = (float (*) [512])((long)pafVar17 + 0x800);
    }
    if (OUTPUT_SMOOTH != 0) {
      puts("Convolution in x direction completed");
    }
    iVar3 = pic_y - iVar1;
    if (pic_y - iVar1 < iVar1) {
      iVar3 = iVar1;
    }
    pfVar7 = pic1[lVar10];
    for (lVar16 = lVar10; pfVar8 = pfVar7, lVar15 = lVar10, lVar16 != iVar2; lVar16 = lVar16 + 1) {
      for (; lVar15 != iVar3; lVar15 = lVar15 + 1) {
        fVar24 = 0.0;
        for (lVar14 = 0; lVar5 + lVar14 <= lVar10; lVar14 = lVar14 + 1) {
          fVar24 = fVar24 + pfVar8[lVar14] * mask[lVar14];
        }
        fVar21 = 255.0;
        if (fVar24 <= 255.0) {
          fVar21 = fVar24;
        }
        fVar24 = 0.0;
        if (0.0 <= fVar21) {
          fVar24 = fVar21;
        }
        floatpic[time][lVar16][lVar15] = fVar24;
        pic[time][lVar16][lVar15] = (uchar)(int)(fVar24 + 0.5);
        pfVar8 = pfVar8 + 1;
      }
      pfVar7 = pfVar7 + 0x200;
    }
    if (OUTPUT_SMOOTH == 0) goto LAB_00104d2d;
    puts("Convolution in y direction completed");
  }
  else {
    pauVar12 = inpic[(long)frame - (long)start];
    pauVar9 = pic[time];
    for (uVar18 = 0; uVar18 != uVar6; uVar18 = uVar18 + 1) {
      for (uVar11 = 0; uVar4 != uVar11; uVar11 = uVar11 + 1) {
        (*(uchar (*) [512])*pauVar9)[uVar11] = (*(uchar (*) [512])*pauVar12)[uVar11];
      }
      pauVar12 = pauVar12 + 1;
      pauVar9 = pauVar9 + 1;
    }
  }
  if (OUTPUT_SMOOTH != 0) {
    puts("End of Convolution");
  }
LAB_00104d2d:
  fflush(_stdout);
  return;
}

Assistant:

void convolve_Gaussian(
unsigned char inpic[PIC_T][PIC_X][PIC_Y],
float floatpic[FIVE][PIC_X][PIC_Y],
unsigned char pic[FIVE][PIC_X][PIC_Y],
float sigma, int pic_t, int pic_x, int pic_y,
int start, int frame, int time)
{
float mask[100],term,sum;
int size,i,j,offset,a,b;


if(OUTPUT_SMOOTH)
{
printf("\nStart of 3D convolution\n");
printf("Time: %d Frame: %d\n",time,frame);
}

fflush(stdout);
size = (int) (6*sigma+1);
if(size%2==0) size = size+1;
offset = size/2;
if(pic_t < size)
	{
	printf("\nFatal error: not enough images\n");
	exit(1);
	}
sum = 0.0;

if(sigma != 0.0)
for(i=0;i<size;i++)
	{
	mask[i] = (1.0/(sqrt(2.0*M_PI)*sigma))*
		exp(-(i-offset)*(i-offset)/(2.0*sigma*sigma));
	sum = sum+mask[i];
	}
else { mask[0] = 1.0; sum = 1.0; }

if(OUTPUT_SMOOTH)
{
printf("Size: %d Offset: %d\nMask values: ",size,offset);
for(i=0;i<size;i++)
	printf("%f ",mask[i]);
printf("\nSum of mask values: %f\n",sum);
}
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic0[i][j] = pic1[i][j] = 0.0;


if(sigma != 0.0)
{
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term +(inpic[a+frame-start][i][j]*mask[a+offset]);
		}
	pic0[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in t direction completed\n");
for(i=offset;i<pic_x-offset;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term + (pic0[i+a][j]*mask[a+offset]);
		}
	pic1[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in x direction completed\n");

for(i=offset;i<pic_x-offset;i++)
for(j=offset;j<pic_y-offset;j++)
	{
	term = 0.0;
	for(b=-offset;b<=offset;b++)
		{
		term = term + (pic1[i][j+b])*mask[b+offset];
		}
	if(term > 255.0) term = 255.0;
	if(term < 0.0) term = 0.0;
	floatpic[time][i][j] = term;
	pic[time][i][j] = (int) (term+0.5);
	}
if(OUTPUT_SMOOTH) printf("Convolution in y direction completed\n");
}
else /* No smoothing */
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic[time][i][j] = inpic[frame-start][i][j];

if(OUTPUT_SMOOTH) printf("End of Convolution\n");
fflush(stdout);
}